

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.cc
# Opt level: O1

Message * __thiscall
google::protobuf::anon_unknown_0::GeneratedMessageFactory::GetPrototype
          (GeneratedMessageFactory *this,Descriptor *type)

{
  WrappedMutex *__mutex;
  unordered_map<const_google::protobuf::Descriptor_*,_const_google::protobuf::Message_*,_std::hash<const_google::protobuf::Descriptor_*>,_std::equal_to<const_google::protobuf::Descriptor_*>,_std::allocator<std::pair<const_google::protobuf::Descriptor_*const,_const_google::protobuf::Message_*>_>_>
  *collection;
  DescriptorPool *pDVar1;
  int iVar2;
  second_type pMVar3;
  DescriptorPool *pDVar4;
  iterator iVar5;
  LogMessage *pLVar6;
  DescriptorTable *table;
  LogFinisher local_61;
  Descriptor *local_60;
  LogMessage local_58;
  
  __mutex = &this->mutex_;
  local_60 = type;
  iVar2 = pthread_mutex_lock((pthread_mutex_t *)__mutex);
  if (iVar2 != 0) {
LAB_0037021f:
    std::__throw_system_error(iVar2);
  }
  collection = &this->type_map_;
  pMVar3 = FindPtrOrNull<std::unordered_map<google::protobuf::Descriptor_const*,google::protobuf::Message_const*,std::hash<google::protobuf::Descriptor_const*>,std::equal_to<google::protobuf::Descriptor_const*>,std::allocator<std::pair<google::protobuf::Descriptor_const*const,google::protobuf::Message_const*>>>>
                     (collection,&local_60);
  pthread_mutex_unlock((pthread_mutex_t *)__mutex);
  if (pMVar3 == (second_type)0x0) {
    pDVar1 = *(DescriptorPool **)(*(long *)(local_60 + 0x10) + 0x10);
    pDVar4 = DescriptorPool::generated_pool();
    if (pDVar1 == pDVar4) {
      local_58._0_8_ = *(undefined8 *)**(undefined8 **)(local_60 + 0x10);
      iVar5 = std::
              _Hashtable<const_char_*,_std::pair<const_char_*const,_const_google::protobuf::internal::DescriptorTable_*>,_std::allocator<std::pair<const_char_*const,_const_google::protobuf::internal::DescriptorTable_*>_>,_std::__detail::_Select1st,_google::protobuf::streq,_google::protobuf::hash<const_char_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
              ::find(&(this->file_map_)._M_h,(key_type *)&local_58);
      if (iVar5.
          super__Node_iterator_base<std::pair<const_char_*const,_const_google::protobuf::internal::DescriptorTable_*>,_true>
          ._M_cur == (__node_type *)0x0) {
        table = (DescriptorTable *)0x0;
      }
      else {
        table = *(DescriptorTable **)
                 ((long)iVar5.
                        super__Node_iterator_base<std::pair<const_char_*const,_const_google::protobuf::internal::DescriptorTable_*>,_true>
                        ._M_cur + 0x10);
      }
      if (table != (DescriptorTable *)0x0) {
        iVar2 = pthread_mutex_lock((pthread_mutex_t *)__mutex);
        if (iVar2 == 0) {
          pMVar3 = FindPtrOrNull<std::unordered_map<google::protobuf::Descriptor_const*,google::protobuf::Message_const*,std::hash<google::protobuf::Descriptor_const*>,std::equal_to<google::protobuf::Descriptor_const*>,std::allocator<std::pair<google::protobuf::Descriptor_const*const,google::protobuf::Message_const*>>>>
                             (collection,&local_60);
          if (pMVar3 == (second_type)0x0) {
            internal::RegisterFileLevelMetadata(table);
            pMVar3 = FindPtrOrNull<std::unordered_map<google::protobuf::Descriptor_const*,google::protobuf::Message_const*,std::hash<google::protobuf::Descriptor_const*>,std::equal_to<google::protobuf::Descriptor_const*>,std::allocator<std::pair<google::protobuf::Descriptor_const*const,google::protobuf::Message_const*>>>>
                               (collection,&local_60);
          }
          if (pMVar3 == (second_type)0x0) {
            internal::LogMessage::LogMessage
                      (&local_58,LOGLEVEL_DFATAL,
                       "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/third_party/protobuf/src/google/protobuf/message.cc"
                       ,0x27c);
            pLVar6 = internal::LogMessage::operator<<
                               (&local_58,"Type appears to be in generated pool but wasn\'t ");
            pLVar6 = internal::LogMessage::operator<<(pLVar6,"registered: ");
            pLVar6 = internal::LogMessage::operator<<(pLVar6,*(string **)(local_60 + 8));
            internal::LogFinisher::operator=(&local_61,pLVar6);
            internal::LogMessage::~LogMessage(&local_58);
          }
          pthread_mutex_unlock((pthread_mutex_t *)__mutex);
          return pMVar3;
        }
        goto LAB_0037021f;
      }
      internal::LogMessage::LogMessage
                (&local_58,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/third_party/protobuf/src/google/protobuf/message.cc"
                 ,0x26a);
      pLVar6 = internal::LogMessage::operator<<
                         (&local_58,"File appears to be in generated pool but wasn\'t registered: ")
      ;
      pLVar6 = internal::LogMessage::operator<<(pLVar6,(string *)**(undefined8 **)(local_60 + 0x10))
      ;
      internal::LogFinisher::operator=(&local_61,pLVar6);
      internal::LogMessage::~LogMessage(&local_58);
    }
    pMVar3 = (second_type)0x0;
  }
  return pMVar3;
}

Assistant:

const Message* GeneratedMessageFactory::GetPrototype(const Descriptor* type) {
  {
    ReaderMutexLock lock(&mutex_);
    const Message* result = FindPtrOrNull(type_map_, type);
    if (result != NULL) return result;
  }

  // If the type is not in the generated pool, then we can't possibly handle
  // it.
  if (type->file()->pool() != DescriptorPool::generated_pool()) return NULL;

  // Apparently the file hasn't been registered yet.  Let's do that now.
  const internal::DescriptorTable* registration_data =
      FindPtrOrNull(file_map_, type->file()->name().c_str());
  if (registration_data == NULL) {
    GOOGLE_LOG(DFATAL) << "File appears to be in generated pool but wasn't "
                   "registered: "
                << type->file()->name();
    return NULL;
  }

  WriterMutexLock lock(&mutex_);

  // Check if another thread preempted us.
  const Message* result = FindPtrOrNull(type_map_, type);
  if (result == NULL) {
    // Nope.  OK, register everything.
    internal::RegisterFileLevelMetadata(registration_data);
    // Should be here now.
    result = FindPtrOrNull(type_map_, type);
  }

  if (result == NULL) {
    GOOGLE_LOG(DFATAL) << "Type appears to be in generated pool but wasn't "
                << "registered: " << type->full_name();
  }

  return result;
}